

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

int lj_record_mm_lookup(jit_State *J,RecordIndex *ix,MMS mm)

{
  byte bVar1;
  GCobj *o;
  uint64_t uVar2;
  IRRef1 IVar3;
  uint uVar4;
  TRef TVar5;
  TRef TVar6;
  uint uVar7;
  cTValue *pcVar8;
  ulong uVar9;
  void *ptr;
  uintptr_t ofs;
  long lVar10;
  GCtab *t;
  TValue local_78;
  ulong local_70;
  TRef local_48;
  TRef local_44;
  undefined4 local_40;
  undefined4 local_34;
  
  uVar7 = ix->tab;
  uVar4 = uVar7 & 0x1f000000;
  if (uVar4 == 0xc000000) {
    ptr = (void *)((ix->tabv).u64 & 0x7fffffffffff);
    bVar1 = *(byte *)((long)ptr + 10);
    t = *(GCtab **)((long)ptr + 0x20);
    if (bVar1 != 0) {
      if (bVar1 == 2) {
        TVar6 = lj_ir_kptr_(J,IR_KPTR,ptr);
        IVar3 = (IRRef1)TVar6;
        (J->fold).ins.field_0.ot = 0x889;
      }
      else {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4510000e;
        uVar7 = lj_opt_fold(J);
        TVar6 = lj_ir_kint(J,(uint)bVar1);
        IVar3 = (IRRef1)TVar6;
        (J->fold).ins.field_0.ot = 0x893;
      }
      (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
      (J->fold).ins.field_0.op2 = IVar3;
      lj_opt_fold(J);
LAB_0012ead7:
      pcVar8 = lj_tab_getstr(t,*(GCstr **)((long)J + (ulong)mm * 8 + -0x138));
      if (pcVar8 == (cTValue *)0x0) {
        return 0;
      }
      uVar2 = pcVar8->it64;
      if (uVar2 != 0xffffffffffffffff) {
        if (((long)uVar2 >> 0x2f != -0xc) && ((long)uVar2 >> 0x2f != -9)) {
          lj_trace_err(J,LJ_TRERR_BADTYPE);
        }
        (ix->mobjv).u64 = uVar2;
        TVar6 = lj_ir_kgc(J,(GCobj *)((ulong)pcVar8->field_4 & 0x7fffffffffff),
                          (uint)((pcVar8->field_4).it >> 0xf != 0x1fff7) * 3 + IRT_FUNC);
        ix->mobj = TVar6;
        ix->mtv = t;
        ix->mt = 0x7fff;
        return 1;
      }
      return 0;
    }
    IVar3 = 0xd;
  }
  else {
    if (uVar4 != 0xb000000) {
      uVar9 = (ix->tabv).it64 >> 0x2f;
      lVar10 = 0x23;
      if (0xfffffffffffffff2 < uVar9) {
        lVar10 = 0x15 - uVar9;
      }
      t = *(GCtab **)((long)J + lVar10 * 8 + -0x138);
      if (t == (GCtab *)0x0) {
        ix->mt = 0x7fff;
        return 0;
      }
      if (uVar4 == 0xa000000) goto LAB_0012ead7;
      ofs = 0x330;
      if (0xfffffffffffffff2 < uVar9) {
        ofs = uVar9 * -8 + 0x2c0;
      }
      local_48 = lj_ir_ggfload(J,IRT_TAB,ofs);
      ix->mt = local_48;
      goto LAB_0012e9ef;
    }
    t = *(GCtab **)(((ix->tabv).u64 & 0x7fffffffffff) + 0x20);
    IVar3 = 7;
  }
  (J->fold).ins.field_0.ot = 0x450b;
  (J->fold).ins.field_0.op1 = (IRRef1)uVar7;
  (J->fold).ins.field_0.op2 = IVar3;
  TVar5 = lj_opt_fold(J);
  TVar6 = 0x7fff;
  if (t != (GCtab *)0x0) {
    TVar6 = TVar5;
  }
  ix->mt = TVar6;
  local_48 = TVar5;
  TVar6 = lj_ir_knull(J,IRT_TAB);
  (J->fold).ins.field_0.ot = (ushort)(t != (GCtab *)0x0) << 8 | 0x88b;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
  lj_opt_fold(J);
LAB_0012e9ef:
  if (t == (GCtab *)0x0) {
    return 0;
  }
  o = *(GCobj **)((long)J + (ulong)mm * 8 + -0x138);
  pcVar8 = lj_tab_getstr(t,&o->str);
  if ((pcVar8 != (cTValue *)0x0) && (pcVar8->u64 != 0xffffffffffffffff)) {
    ix->mobjv = (TValue)pcVar8->u64;
  }
  ix->mtv = t;
  local_78.u64 = (ulong)t | 0xfffa000000000000;
  local_70 = (ulong)o | 0xfffd800000000000;
  local_44 = lj_ir_kgc(J,o,IRT_STR);
  local_40 = 0;
  local_34 = 0;
  TVar6 = lj_record_idx(J,(RecordIndex *)&local_78.gcr);
  ix->mobj = TVar6;
  return (uint)((TVar6 & 0x1f000000) != 0);
}

Assistant:

int lj_record_mm_lookup(jit_State *J, RecordIndex *ix, MMS mm)
{
  RecordIndex mix;
  GCtab *mt;
  if (tref_istab(ix->tab)) {
    mt = tabref(tabV(&ix->tabv)->metatable);
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
  } else if (tref_isudata(ix->tab)) {
    int udtype = udataV(&ix->tabv)->udtype;
    mt = tabref(udataV(&ix->tabv)->metatable);
    /* The metatables of special userdata objects are treated as immutable. */
    if (udtype != UDTYPE_USERDATA) {
      cTValue *mo;
      if (LJ_HASFFI && udtype == UDTYPE_FFI_CLIB) {
	/* Specialize to the C library namespace object. */
	emitir(IRTG(IR_EQ, IRT_PGC), ix->tab, lj_ir_kptr(J, udataV(&ix->tabv)));
      } else {
	/* Specialize to the type of userdata. */
	TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), ix->tab, IRFL_UDATA_UDTYPE);
	emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, udtype));
      }
  immutable_mt:
      mo = lj_tab_getstr(mt, mmname_str(J2G(J), mm));
      if (!mo || tvisnil(mo))
	return 0;  /* No metamethod. */
      /* Treat metamethod or index table as immutable, too. */
      if (!(tvisfunc(mo) || tvistab(mo)))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      copyTV(J->L, &ix->mobjv, mo);
      ix->mobj = lj_ir_kgc(J, gcV(mo), tvisfunc(mo) ? IRT_FUNC : IRT_TAB);
      ix->mtv = mt;
      ix->mt = TREF_NIL;  /* Dummy value for comparison semantics. */
      return 1;  /* Got metamethod or index table. */
    }
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_UDATA_META);
  } else {
    /* Specialize to base metatable. Must flush mcode in lua_setmetatable(). */
    mt = tabref(basemt_obj(J2G(J), &ix->tabv));
    if (mt == NULL) {
      ix->mt = TREF_NIL;
      return 0;  /* No metamethod. */
    }
    /* The cdata metatable is treated as immutable. */
    if (LJ_HASFFI && tref_iscdata(ix->tab)) goto immutable_mt;
    ix->mt = mix.tab = lj_ir_ggfload(J, IRT_TAB,
      GG_OFS(g.gcroot[GCROOT_BASEMT+itypemap(&ix->tabv)]));
    goto nocheck;
  }
  ix->mt = mt ? mix.tab : TREF_NIL;
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mix.tab, lj_ir_knull(J, IRT_TAB));
nocheck:
  if (mt) {
    GCstr *mmstr = mmname_str(J2G(J), mm);
    cTValue *mo = lj_tab_getstr(mt, mmstr);
    if (mo && !tvisnil(mo))
      copyTV(J->L, &ix->mobjv, mo);
    ix->mtv = mt;
    settabV(J->L, &mix.tabv, mt);
    setstrV(J->L, &mix.keyv, mmstr);
    mix.key = lj_ir_kstr(J, mmstr);
    mix.val = 0;
    mix.idxchain = 0;
    ix->mobj = lj_record_idx(J, &mix);
    return !tref_isnil(ix->mobj);  /* 1 if metamethod found, 0 if not. */
  }
  return 0;  /* No metamethod. */
}